

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

value_type_conflict2 __thiscall
Darts::DoubleArrayImpl<void,_void,_int,_void>::traverse
          (DoubleArrayImpl<void,_void,_int,_void> *this,key_type *key,size_t *node_pos,
          size_t *key_pos,size_t length)

{
  unit_type *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  uVar5 = *node_pos;
  puVar1 = this->array_;
  uVar2 = puVar1[uVar5 & 0xffffffff].unit_;
  sVar6 = *key_pos;
  if (length == 0) {
    while( true ) {
      uVar4 = (uint)uVar5;
      uVar3 = (uint)(byte)key[sVar6];
      if (uVar3 == 0) break;
      uVar5 = (ulong)((uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8) ^ uVar4 ^ uVar3);
      uVar2 = puVar1[uVar5].unit_;
      if ((uVar2 & 0x800000ff) != uVar3) {
        return -2;
      }
      *node_pos = uVar5;
      sVar6 = *key_pos + 1;
      *key_pos = sVar6;
    }
  }
  else {
    while (uVar4 = (uint)uVar5, sVar6 < length) {
      uVar5 = (ulong)((uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8) ^ uVar4 ^ (uint)(byte)key[sVar6]);
      uVar2 = puVar1[uVar5].unit_;
      if ((uVar2 & 0x800000ff) != (uint)(byte)key[sVar6]) {
        return -2;
      }
      *node_pos = uVar5;
      sVar6 = *key_pos + 1;
      *key_pos = sVar6;
    }
  }
  if ((uVar2 >> 8 & 1) == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = puVar1[(uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8) ^ uVar4].unit_ & 0x7fffffff;
  }
  return uVar2;
}

Assistant:

inline typename DoubleArrayImpl<A, B, T, C>::value_type
DoubleArrayImpl<A, B, T, C>::traverse(const key_type *key,
    std::size_t &node_pos, std::size_t &key_pos, std::size_t length) const {
  id_type id = static_cast<id_type>(node_pos);
  unit_type unit = array_[id];

  if (length != 0) {
    for ( ; key_pos < length; ++key_pos) {
      id ^= unit.offset() ^ static_cast<uchar_type>(key[key_pos]);
      unit = array_[id];
      if (unit.label() != static_cast<uchar_type>(key[key_pos])) {
        return static_cast<value_type>(-2);
      }
      node_pos = id;
    }
  } else {
    for ( ; key[key_pos] != '\0'; ++key_pos) {
      id ^= unit.offset() ^ static_cast<uchar_type>(key[key_pos]);
      unit = array_[id];
      if (unit.label() != static_cast<uchar_type>(key[key_pos])) {
        return static_cast<value_type>(-2);
      }
      node_pos = id;
    }
  }

  if (!unit.has_leaf()) {
    return static_cast<value_type>(-1);
  }
  unit = array_[id ^ unit.offset()];
  return static_cast<value_type>(unit.value());
}